

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_protection(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int sn_00;
  AFFECT_DATA af;
  
  sn_00 = skill_lookup("protection");
  bVar1 = is_affected(ch,sn_00);
  if (bVar1) {
    send_to_char("You are already protected.\n\r",ch);
    return;
  }
  init_affect(&af);
  af.where = 0;
  af.aftype = get_spell_aftype(ch);
  af.type = (short)sn;
  af.level = (short)level;
  af.duration = (short)(level / 2);
  af.modifier = 0;
  af.mod_name = 8;
  af.bitvector[0]._1_1_ = af.bitvector[0]._1_1_ | 0x20;
  affect_to_char(ch,&af);
  send_to_char("You feel protected.\n\r",ch);
  return;
}

Assistant:

void spell_protection(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, skill_lookup("protection")))
	{
		send_to_char("You are already protected.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level / 2;
	af.modifier = 0;

	SET_BIT(af.bitvector, AFF_PROTECTION);

	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	send_to_char("You feel protected.\n\r", ch);
}